

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage1Runner.hpp
# Opt level: O0

void * __thiscall Centaurus::Stage1Runner::acquire_bank(Stage1Runner *this)

{
  bool bVar1;
  WindowBankState local_20;
  int local_1c;
  WindowBankState old_state;
  int i;
  WindowBankEntry *banks;
  Stage1Runner *this_local;
  
  _old_state = (this->super_BaseRunner).m_sub_window;
  banks = (WindowBankEntry *)this;
  do {
    for (local_1c = 0; local_1c < (this->super_BaseRunner).m_bank_num; local_1c = local_1c + 1) {
      local_20 = Free;
      bVar1 = std::atomic<Centaurus::BaseRunner::WindowBankState>::compare_exchange_weak
                        ((atomic<Centaurus::BaseRunner::WindowBankState> *)
                         ((long)_old_state + (long)local_1c * 8 + 4),&local_20,Stage1_Locked,
                         memory_order_seq_cst);
      if (bVar1) {
        this->m_current_bank = local_1c;
        return (void *)((long)(this->super_BaseRunner).m_main_window +
                       (this->super_BaseRunner).m_bank_size * (long)local_1c);
      }
    }
  } while( true );
}

Assistant:

void *acquire_bank()
  {
    WindowBankEntry *banks = (WindowBankEntry *)m_sub_window;
    while (true) {
      for (int i = 0; i < m_bank_num; i++) {
        WindowBankState old_state = WindowBankState::Free;
        if (banks[i].state.compare_exchange_weak(old_state, WindowBankState::Stage1_Locked)) {
          m_current_bank = i;
          return (char *)m_main_window + m_bank_size * i;
        }
      }
    }
  }